

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

void outputHandleMode(void *userData,wl_output *output,uint32_t flags,int32_t width,int32_t height,
                     int32_t refresh)

{
  void *pvVar1;
  undefined8 *puVar2;
  double dVar3;
  GLFWvidmode mode;
  _GLFWmonitor *monitor;
  int32_t refresh_local;
  int32_t height_local;
  int32_t width_local;
  uint32_t flags_local;
  wl_output *output_local;
  void *userData_local;
  
  dVar3 = round((double)refresh / 1000.0);
  *(int *)((long)userData + 0xa0) = *(int *)((long)userData + 0xa0) + 1;
  pvVar1 = _glfw_realloc(*(void **)((long)userData + 0x98),
                         (long)*(int *)((long)userData + 0xa0) * 0x18);
  *(void **)((long)userData + 0x98) = pvVar1;
  puVar2 = (undefined8 *)
           (*(long *)((long)userData + 0x98) + (long)(*(int *)((long)userData + 0xa0) + -1) * 0x18);
  *puVar2 = CONCAT44(height,width);
  puVar2[1] = 0x800000008;
  puVar2[2] = CONCAT44((int)dVar3,8);
  if ((flags & 1) != 0) {
    *(int *)((long)userData + 0x10c) = *(int *)((long)userData + 0xa0) + -1;
  }
  return;
}

Assistant:

static void outputHandleMode(void* userData,
                             struct wl_output* output,
                             uint32_t flags,
                             int32_t width,
                             int32_t height,
                             int32_t refresh)
{
    struct _GLFWmonitor* monitor = userData;
    GLFWvidmode mode;

    mode.width = width;
    mode.height = height;
    mode.redBits = 8;
    mode.greenBits = 8;
    mode.blueBits = 8;
    mode.refreshRate = (int) round(refresh / 1000.0);

    monitor->modeCount++;
    monitor->modes =
        _glfw_realloc(monitor->modes, monitor->modeCount * sizeof(GLFWvidmode));
    monitor->modes[monitor->modeCount - 1] = mode;

    if (flags & WL_OUTPUT_MODE_CURRENT)
        monitor->wl.currentMode = monitor->modeCount - 1;
}